

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O2

int GetAllObstaclesDist5
              (uchar *scanline,uchar threshold,int diffstep,double minDist,double maxDist,int NBins,
              int RangeScale,uchar ADLow,uchar ADSpan,int adc8on,
              vector<interval,_std::allocator<interval>_> *distances)

{
  uint uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  void *__ptr;
  long lVar5;
  char cVar6;
  int iVar7;
  undefined7 in_register_00000031;
  double *a;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double d0;
  double local_80;
  double d1;
  int local_70;
  undefined4 local_6c;
  double local_68;
  double local_60;
  double local_58;
  double maxDist_local;
  interval local_48;
  
  local_6c = (undefined4)CONCAT71(in_register_00000031,threshold);
  local_68 = (double)NBins;
  local_60 = local_68 / (double)RangeScale;
  iVar7 = (int)(maxDist * local_60);
  if (NBins + -1 < (int)(maxDist * local_60)) {
    iVar7 = NBins + -1;
  }
  d0 = -1.0;
  d1 = -1.0;
  local_80 = minDist;
  maxDist_local = maxDist;
  __ptr = malloc((long)NBins);
  if (__ptr == (void *)0x0) {
    iVar7 = 1;
  }
  else {
    dVar11 = (double)RangeScale / local_68;
    uVar1 = (int)(local_60 * local_80);
    if ((int)(local_60 * local_80) < 1) {
      uVar1 = 0;
    }
    local_80 = (double)CONCAT44(local_80._4_4_,iVar7);
    uVar9 = (ulong)uVar1;
    local_70 = diffstep;
    for (uVar8 = uVar9; (long)uVar8 <= (long)iVar7; uVar8 = uVar8 + 1) {
      bVar3 = DynamicRangeControl(scanline[uVar8],ADLow,ADSpan,adc8on);
      *(char *)((long)__ptr + uVar8) = (bVar3 < (byte)local_6c) + -1;
    }
    iVar7 = local_80._0_4_ - local_70;
    lVar5 = (long)local_70;
    dVar10 = -1.0;
    for (; (long)uVar9 <= (long)iVar7; uVar9 = uVar9 + 1) {
      iVar4 = (uint)*(byte *)((long)__ptr + uVar9 + lVar5) - (uint)*(byte *)((long)__ptr + uVar9);
      cVar2 = (char)iVar4;
      cVar6 = -cVar2;
      if (0 < iVar4) {
        cVar6 = cVar2;
      }
      if (cVar6 == -1) {
        if (dVar10 < 0.0) {
          dVar10 = (double)(int)uVar9 * dVar11;
          d0 = dVar10;
        }
      }
      else if (0.0 <= dVar10) {
        d1 = (double)((int)uVar9 + -1) * dVar11;
        interval::interval(&local_48,&d0,&d1);
        std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
                  (distances,(vector<interval,_std::allocator<interval>_> *)&local_48);
        d0 = -1.0;
        d1 = -1.0;
        dVar10 = -1.0;
      }
    }
    if (0.0 <= dVar10) {
      a = &d0;
    }
    else {
      a = &maxDist_local;
    }
    local_58 = INFINITY;
    interval::interval(&local_48,a,&local_58);
    std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
              (distances,(vector<interval,_std::allocator<interval>_> *)&local_48);
    free(__ptr);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

inline int GetAllObstaclesDist5(unsigned char* scanline, unsigned char threshold, int diffstep, double minDist, double maxDist, 
								int NBins, int RangeScale, unsigned char ADLow, unsigned char ADSpan, int adc8on, vector<interval>& distances)
{
	double r0 = (double)NBins/(double)RangeScale;
	double r1 = (double)RangeScale/(double)NBins;
	int minBin = max(0, (int)(minDist*r0));
	int maxBin = min(NBins-1, (int)(maxDist*r0));
	int i = 0;
	double d0 = -1, d1 = -1;
	unsigned char* scanlinethreshhold = NULL;

	scanlinethreshhold = (unsigned char*)malloc(NBins*sizeof(unsigned char));
	if (scanlinethreshhold == NULL)
	{
		return EXIT_FAILURE;
	}

	i = minBin;
	while (i <= maxBin)
	{
		if (DynamicRangeControl(scanline[i], ADLow, ADSpan, adc8on) >= threshold)
		{
			scanlinethreshhold[i] = 255;
		}
		else
		{
			scanlinethreshhold[i] = 0;
		}
		i++;
	}

	i = minBin;
	while (i <= maxBin-diffstep)
	{
		if (abs((int)(scanlinethreshhold[i+diffstep]-scanlinethreshhold[i])) >= 255)
		{
			if (d0 < 0) 
			{
				d0 = (double)i*r1; // Convert in m.
			}
		}
		else
		{
			if (d0 >= 0) 
			{
				d1 = (double)(i-1)*r1; // Convert in m.
				distances.push_back(interval(d0, d1));
				d0 = -1;
				d1 = -1;
			}
		}
		i++;
	}

	if (d0 >= 0) 
	{
		distances.push_back(interval(d0, oo));
	}
	else
	{
		distances.push_back(interval(maxDist, oo));
	}

	free(scanlinethreshhold);

	return EXIT_SUCCESS;
}